

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb3Image.c
# Opt level: O1

void Llb_NonlinImageQuit(void)

{
  DdManager *table;
  
  if (p != (Llb_Mgr_t *)0x0) {
    table = p->dd;
    Llb_NonlinFree(p);
    if (table->bFunc != (DdNode *)0x0) {
      Cudd_RecursiveDeref(table,table->bFunc);
    }
    Extra_StopManager(table);
    p = (Llb_Mgr_t *)0x0;
  }
  return;
}

Assistant:

void Llb_NonlinImageQuit()
{
    DdManager * dd;
    if ( p == NULL )
        return;
    dd = p->dd;
    Llb_NonlinFree( p );
    if ( dd->bFunc )
        Cudd_RecursiveDeref( dd, dd->bFunc );
    Extra_StopManager( dd );
//    Cudd_Quit ( dd );
    p = NULL;
}